

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HubContext.h
# Opt level: O2

value_type __thiscall SL::WS_LITE::HubContext::getnextContext(HubContext *this)

{
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong *in_RSI;
  value_type vVar2;
  
  LOCK();
  uVar1 = *in_RSI;
  *in_RSI = *in_RSI + 1;
  UNLOCK();
  std::__shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2> *)
             (in_RSI[1] + (uVar1 % (ulong)((long)(in_RSI[2] - in_RSI[1]) >> 4)) * 0x10));
  vVar2.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  vVar2.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_type)
         vVar2.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto getnextContext() { return ThreadContexts[(m_nextService++ % ThreadContexts.size())]; }